

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cProgramInterfaceQueryTests.cpp
# Opt level: O0

string * __thiscall
gl4cts::(anonymous_namespace)::NoLocations::FragmentShader_abi_cxx11_
          (string *__return_storage_ptr__,void *this)

{
  allocator<char> local_19;
  void *local_18;
  NoLocations *this_local;
  
  local_18 = this;
  this_local = (NoLocations *)__return_storage_ptr__;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,
             "#version 430                   \nout vec4 a;                    \nout vec4 b;                    \nout vec4 c;                    \nout vec4 d[1];                 \nvoid main() {                  \n    a = vec4(0, 1, 0, 1);      \n    b = vec4(0, 1, 0, 1);      \n    c = vec4(0, 1, 0, 1);      \n    d[0] = vec4(0, 1, 0, 1);   \n}"
             ,&local_19);
  std::allocator<char>::~allocator(&local_19);
  return __return_storage_ptr__;
}

Assistant:

virtual std::string FragmentShader()
	{
		return "#version 430                   \n"
			   "out vec4 a;                    \n"
			   "out vec4 b;                    \n"
			   "out vec4 c;                    \n"
			   "out vec4 d[1];                 \n"
			   "void main() {                  \n"
			   "    a = vec4(0, 1, 0, 1);      \n"
			   "    b = vec4(0, 1, 0, 1);      \n"
			   "    c = vec4(0, 1, 0, 1);      \n"
			   "    d[0] = vec4(0, 1, 0, 1);   \n"
			   "}";
	}